

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DelayedObjects.hpp
# Opt level: O2

void __thiscall
gmlc::concurrency::
DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
setDelayedValue(DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *this,int index,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *val)

{
  iterator __position;
  mapped_type *this_00;
  int local_2c;
  
  local_2c = index;
  CLI::std::mutex::lock((mutex *)&this->promiseLock);
  __position = std::
               _Rb_tree<int,_std::pair<const_int,_std::promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Select1st<std::pair<const_int,_std::promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::find((_Rb_tree<int,_std::pair<const_int,_std::promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Select1st<std::pair<const_int,_std::promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       *)this,&local_2c);
  if ((_Rb_tree_header *)__position._M_node !=
      &(this->promiseByInteger)._M_t._M_impl.super__Rb_tree_header) {
    std::promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    set_value((promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&__position._M_node[1]._M_parent,val);
    this_00 = std::
              map<int,_std::promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ::operator[](&this->usedPromiseByInteger,&local_2c);
    std::promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    operator=(this_00,(promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&__position._M_node[1]._M_parent);
    std::
    _Rb_tree<int,std::pair<int_const,std::promise<std::__cxx11::string>>,std::_Select1st<std::pair<int_const,std::promise<std::__cxx11::string>>>,std::less<int>,std::allocator<std::pair<int_const,std::promise<std::__cxx11::string>>>>
    ::erase_abi_cxx11_((_Rb_tree<int,std::pair<int_const,std::promise<std::__cxx11::string>>,std::_Select1st<std::pair<int_const,std::promise<std::__cxx11::string>>>,std::less<int>,std::allocator<std::pair<int_const,std::promise<std::__cxx11::string>>>>
                        *)this,__position);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->promiseLock);
  return;
}

Assistant:

void setDelayedValue(int index, X&& val)
    {
        std::lock_guard<std::mutex> lock(promiseLock);
        auto fnd = promiseByInteger.find(index);
        if (fnd != promiseByInteger.end()) {
            fnd->second.set_value(std::move(val));
            usedPromiseByInteger[index] = std::move(fnd->second);
            promiseByInteger.erase(fnd);
        }
    }